

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O0

void __thiscall
Clasp::PBBuilder::prepareProblem
          (PBBuilder *this,uint32 numVars,uint32 numProd,uint32 numSoft,uint32 numCons)

{
  Var x;
  Var VVar1;
  SharedContext *pSVar2;
  uint32 in_ECX;
  int in_EDX;
  int in_ESI;
  OutputTable *in_RDI;
  VarType in_R8D;
  uint32 unaff_retaddr;
  SharedContext *in_stack_00000008;
  Var out;
  RangeType *r;
  Range<unsigned_int> local_24;
  undefined4 in_stack_ffffffffffffffe4;
  uint8 flags;
  
  flags = (uint8)((uint)in_stack_ffffffffffffffe4 >> 0x18);
  pSVar2 = ProgramBuilder::ctx((ProgramBuilder *)in_RDI);
  if (pSVar2 == (SharedContext *)0x0) {
    Potassco::fail(-2,"void Clasp::PBBuilder::prepareProblem(uint32, uint32, uint32, uint32)",0xe7,
                   "ctx()","startProgram() not called!",0);
  }
  ProgramBuilder::ctx((ProgramBuilder *)in_RDI);
  x = SharedContext::addVars((SharedContext *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,flags);
  ProgramBuilder::ctx((ProgramBuilder *)in_RDI);
  VVar1 = SharedContext::addVars
                    ((SharedContext *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,(uint8)(x >> 0x18));
  *(Var *)&in_RDI[1].theory = VVar1;
  *(uint32 *)((long)&in_RDI[1].theory + 4) = *(int *)&in_RDI[1].theory + in_EDX + in_ECX;
  pSVar2 = ProgramBuilder::ctx((ProgramBuilder *)in_RDI);
  r = (RangeType *)&pSVar2->output;
  Range<unsigned_int>::Range(&local_24,x,x + in_ESI);
  OutputTable::setVarRange(in_RDI,r);
  ProgramBuilder::ctx((ProgramBuilder *)in_RDI);
  SharedContext::startAddConstraints(in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

void PBBuilder::prepareProblem(uint32 numVars, uint32 numProd, uint32 numSoft, uint32 numCons) {
	POTASSCO_REQUIRE(ctx(), "startProgram() not called!");
	Var out = ctx()->addVars(numVars, Var_t::Atom, VarInfo::Nant | VarInfo::Input);
	auxVar_ = ctx()->addVars(numProd + numSoft, Var_t::Atom, VarInfo::Nant);
	endVar_ = auxVar_ + numProd + numSoft;
	ctx()->output.setVarRange(Range32(out, out + numVars));
	ctx()->startAddConstraints(numCons);
}